

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

void Pdr_OblDeref(Pdr_Obl_t *p)

{
  int iVar1;
  Pdr_Obl_t *p_local;
  
  iVar1 = p->nRefs + -1;
  p->nRefs = iVar1;
  if (iVar1 == 0) {
    if (p->pNext != (Pdr_Obl_t *)0x0) {
      Pdr_OblDeref(p->pNext);
    }
    Pdr_SetDeref(p->pState);
    if (p != (Pdr_Obl_t *)0x0) {
      free(p);
    }
  }
  return;
}

Assistant:

void Pdr_OblDeref( Pdr_Obl_t * p )
{
    if ( --p->nRefs == 0 )
    {
        if ( p->pNext )
            Pdr_OblDeref( p->pNext );
        Pdr_SetDeref( p->pState );
        ABC_FREE( p );
    }
}